

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  int64_t *piVar1;
  timestamp_t tVar2;
  string_t specifier;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  piVar1 = *(int64_t **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    specifier.value._8_4_ = **(undefined4 **)(right + 0x20);
    specifier.value._0_8_ = (*(undefined8 **)(left + 0x20))[1];
    specifier.value._12_4_ = 0;
    tVar2 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                      ((DateTruncBinaryOperator *)**(undefined8 **)(left + 0x20),specifier,
                       (date_t)(int32_t)*(undefined4 **)(right + 0x20));
    *piVar1 = tVar2.value;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}